

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control.cc
# Opt level: O1

void __thiscall ipx::Control::hLog(Control *this,string *str)

{
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *this_00;
  HighsLogOptions *pHVar1;
  HighsLogOptions log_options_;
  HighsLogOptions local_78;
  
  if ((this->parameters_).super_ipx_parameters.highs_logging == true) {
    pHVar1 = (this->parameters_).super_ipx_parameters.log_options;
    local_78.log_stream = pHVar1->log_stream;
    local_78.output_flag = pHVar1->output_flag;
    local_78.log_to_console = pHVar1->log_to_console;
    local_78.log_dev_level = pHVar1->log_dev_level;
    local_78.user_log_callback = pHVar1->user_log_callback;
    local_78.user_log_callback_data = pHVar1->user_log_callback_data;
    this_00 = &local_78.user_callback;
    std::
    function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
    ::function(this_00,&pHVar1->user_callback);
    local_78.user_callback_active = pHVar1->user_callback_active;
    local_78.user_callback_data = pHVar1->user_callback_data;
    highsLogUser(&local_78,kInfo,"%s",(str->_M_dataplus)._M_p);
    if (local_78.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_78.user_callback.super__Function_base._M_manager)
                ((_Any_data *)this_00,(_Any_data *)this_00,__destroy_functor);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (&(this->output_).super_ostream,(str->_M_dataplus)._M_p,str->_M_string_length);
  return;
}

Assistant:

void Control::hLog(std::string str) const {
  if (parameters_.highs_logging) {
    assert(parameters_.log_options);
    HighsLogOptions log_options_ = *(parameters_.log_options);
    highsLogUser(log_options_, HighsLogType::kInfo, "%s", str.c_str());
  } else {
    output_ << str;
  }

}